

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int killbuffer_cmd(int f,int n)

{
  int iVar1;
  char *bname;
  buffer *bp;
  char local_418 [8];
  char bufn [1024];
  
  bp = curbp;
  if ((f & 8U) == 0) {
    bname = eread("Kill buffer (default %s): ",local_418,0x400,0x4a,(curbp->b_list).l_name);
    if (bname == (char *)0x0) {
      return 2;
    }
    bp = curbp;
    if ((*bname != '\0') && (bp = bfind(bname,0), bp == (buffer *)0x0)) {
      return 0;
    }
  }
  iVar1 = killbuffer(bp);
  eerase();
  return iVar1;
}

Assistant:

int
killbuffer_cmd(int f, int n)
{
	struct buffer *bp;
	char    bufn[NBUFN], *bufp;
	int 	ret;

	if (f & FFRAND) /* dired mode 'q' */
		bp = curbp;
	else if ((bufp = eread("Kill buffer (default %s): ", bufn, NBUFN,
	    EFNUL | EFNEW | EFBUF, curbp->b_bname)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		bp = curbp;
	else if ((bp = bfind(bufp, FALSE)) == NULL)
		return (FALSE);
	ret = killbuffer(bp);
	eerase();

	return (ret);
}